

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCMakeProjects
          (cmCPackGenerator *this,bool setDestDir,string *baseTempInstallDirectory,
          mode_t *default_dir_mode)

{
  cmCPackLog *pcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *__s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cmake *this_00;
  cmGlobalGenerator *pcVar6;
  ostream *poVar7;
  pointer pbVar8;
  string *installType;
  pointer pbVar9;
  byte bVar10;
  allocator<char> local_359;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentsVector;
  string buildConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeProjectsVector;
  cmCPackInstallCMakeProject project;
  string installProjectName;
  string installDirectory;
  string absoluteDestFiles;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_CMAKE_PROJECTS",(allocator<char> *)&project);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_CMAKE_GENERATOR",(allocator<char> *)&project);
  __s = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  absoluteDestFiles._M_dataplus._M_p = (pointer)&absoluteDestFiles.field_2;
  absoluteDestFiles._M_string_length = 0;
  absoluteDestFiles.field_2._M_local_buf[0] = '\0';
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    if (__s == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_INSTALL_CMAKE_PROJECTS is specified, but CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR is required to install the project."
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x205,project.Directory._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&project);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_001455c5:
      iVar4 = 0;
      goto LAB_001455c7;
    }
    cmakeProjectsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmakeProjectsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmakeProjectsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar5,(allocator<char> *)&project);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&cmakeProjectsVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    for (pbVar8 = cmakeProjectsVector.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != cmakeProjectsVector.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 4) {
      if (((pbVar8 + 1 ==
            cmakeProjectsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) ||
          (pbVar8 + 2 ==
           cmakeProjectsVector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) ||
         (pbVar8 + 3 ==
          cmakeProjectsVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install directory, install project name, install component, and install subdirectory."
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x216,project.Directory._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&project);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_001455bb:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&cmakeProjectsVector);
        goto LAB_001455c5;
      }
      std::__cxx11::string::string((string *)&installDirectory,(string *)pbVar8);
      std::__cxx11::string::string((string *)&installProjectName,(string *)(pbVar8 + 1));
      project.Directory._M_dataplus._M_p = (pointer)&project.Directory.field_2;
      project.Directory._M_string_length = 0;
      project.Directory.field_2._M_local_buf[0] = '\0';
      project.ProjectName._M_dataplus._M_p = (pointer)&project.ProjectName.field_2;
      project.ProjectName._M_string_length = 0;
      project.ProjectName.field_2._M_local_buf[0] = '\0';
      project.Component._M_dataplus._M_p = (pointer)&project.Component.field_2;
      project.Component._M_string_length = 0;
      project.Component.field_2._M_local_buf[0] = '\0';
      project.SubDirectory._M_dataplus._M_p = (pointer)&project.SubDirectory.field_2;
      project.SubDirectory._M_string_length = 0;
      project.SubDirectory.field_2._M_local_buf[0] = '\0';
      project.Components.super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      project.Components.super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      project.InstallationTypes.
      super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      project.Components.super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      project.InstallationTypes.
      super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      project.InstallationTypes.
      super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__cxx11::string::_M_assign((string *)&project);
      std::__cxx11::string::_M_assign((string *)&project.ProjectName);
      std::__cxx11::string::_M_assign((string *)&project.Component);
      std::__cxx11::string::_M_assign((string *)&project.SubDirectory);
      componentsVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      componentsVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      componentsVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar4 = (*this->_vptr_cmCPackGenerator[0x18])(this);
      if ((char)iVar4 == '\0') {
LAB_00144f84:
        bVar10 = 0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_MONOLITHIC_INSTALL",
                   (allocator<char> *)&buildConfig);
        bVar3 = IsOn(this,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        if (bVar3) goto LAB_00144f84;
        cmsys::SystemTools::UpperCase((string *)&installTypesVector,&project.Component);
        std::operator+(&buildConfig,"CPACK_",(string *)&installTypesVector);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,&buildConfig,"_INSTALL_TYPES");
        std::__cxx11::string::~string((string *)&buildConfig);
        std::__cxx11::string::~string((string *)&installTypesVector);
        pcVar5 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cmCPackLog_msg);
        if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
          installTypesVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          installTypesVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          installTypesVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&buildConfig,pcVar5,&local_359);
          cmSystemTools::ExpandListArgument(&buildConfig,&installTypesVector,false);
          std::__cxx11::string::~string((string *)&buildConfig);
          pbVar2 = installTypesVector.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar9 = installTypesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2;
              pbVar9 = pbVar9 + 1) {
            iVar4 = (*this->_vptr_cmCPackGenerator[0x1a])(this,&project.ProjectName,pbVar9);
            buildConfig._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar4);
            std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
            emplace_back<cmCPackInstallationType*>
                      ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                       &project.InstallationTypes,(cmCPackInstallationType **)&buildConfig);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&installTypesVector);
        }
        cmsys::SystemTools::UpperCase((string *)&installTypesVector,&project.Component);
        std::operator+(&buildConfig,"CPACK_COMPONENTS_",(string *)&installTypesVector);
        std::__cxx11::string::~string((string *)&installTypesVector);
        pcVar5 = GetOption(this,&buildConfig);
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
          bVar10 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&installTypesVector,pcVar5,&local_359);
          cmSystemTools::ExpandListArgument((string *)&installTypesVector,&componentsVector,false);
          std::__cxx11::string::~string((string *)&installTypesVector);
          pbVar2 = componentsVector.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar9 = componentsVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2;
              pbVar9 = pbVar9 + 1) {
            iVar4 = (*this->_vptr_cmCPackGenerator[0x1b])(this,&project.ProjectName,pbVar9);
            installTypesVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar4);
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            emplace_back<cmCPackComponent*>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       &project.Components,(cmCPackComponent **)&installTypesVector);
          }
          bVar10 = 1;
        }
        std::__cxx11::string::~string((string *)&buildConfig);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
      if (componentsVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          componentsVector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&componentsVector,&project.Component);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_BUILD_CONFIG",(allocator<char> *)&buildConfig);
      pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buildConfig,pcVar5,(allocator<char> *)&cmCPackLog_msg);
      this_00 = cmMakefile::GetCMakeInstance(this->MakefileMap);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,__s,(allocator<char> *)&installTypesVector);
      pcVar6 = cmake::CreateGlobalGenerator(this_00,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (pcVar6 == (cmGlobalGenerator *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Specified package generator not found. CPACK_CMAKE_GENERATOR value is invalid."
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,599,(char *)installTypesVector.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&installTypesVector);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00145580:
        std::__cxx11::string::~string((string *)&buildConfig);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&componentsVector);
        cmCPackInstallCMakeProject::~cmCPackInstallCMakeProject(&project);
        std::__cxx11::string::~string((string *)&installProjectName);
        std::__cxx11::string::~string((string *)&installDirectory);
        goto LAB_001455bb;
      }
      cmSystemTools::s_ForceUnixPaths = pcVar6->ForceUnixPaths;
      iVar4 = (*this->_vptr_cmCPackGenerator[0x14])
                        (this,&project.ProjectName,&project,pcVar6,&buildConfig);
      if (iVar4 == 0) goto LAB_00145580;
      (*pcVar6->_vptr_cmGlobalGenerator[1])(pcVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install project: ");
      poVar7 = std::operator<<(poVar7,(string *)&project.ProjectName);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x267,(char *)installTypesVector.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&installTypesVector);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      pbVar2 = componentsVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar9 = componentsVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (pbVar9 != pbVar2) {
        iVar4 = (*this->_vptr_cmCPackGenerator[0x15])
                          (this,(ulong)setDestDir,&project,baseTempInstallDirectory,default_dir_mode
                           ,pbVar9,(ulong)bVar10,&project.SubDirectory,&buildConfig,
                           &absoluteDestFiles);
        pbVar9 = pbVar9 + 1;
        if (iVar4 == 0) goto LAB_00145580;
      }
      std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>::
      push_back(&this->CMakeProjects,&project);
      std::__cxx11::string::~string((string *)&buildConfig);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&componentsVector);
      cmCPackInstallCMakeProject::~cmCPackInstallCMakeProject(&project);
      std::__cxx11::string::~string((string *)&installProjectName);
      std::__cxx11::string::~string((string *)&installDirectory);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeProjectsVector);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_ABSOLUTE_DESTINATION_FILES",
             (allocator<char> *)&project);
  SetOption(this,(string *)&cmCPackLog_msg,absoluteDestFiles._M_dataplus._M_p);
  iVar4 = 1;
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
LAB_001455c7:
  std::__cxx11::string::~string((string *)&absoluteDestFiles);
  return iVar4;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCMakeProjects(
  bool setDestDir, const std::string& baseTempInstallDirectory,
  const mode_t* default_dir_mode)
{
  const char* cmakeProjects = this->GetOption("CPACK_INSTALL_CMAKE_PROJECTS");
  const char* cmakeGenerator = this->GetOption("CPACK_CMAKE_GENERATOR");
  std::string absoluteDestFiles;
  if (cmakeProjects && *cmakeProjects) {
    if (!cmakeGenerator) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_INSTALL_CMAKE_PROJECTS is specified, but "
                    "CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR "
                    "is required to install the project."
                      << std::endl);
      return 0;
    }
    std::vector<std::string> cmakeProjectsVector;
    cmSystemTools::ExpandListArgument(cmakeProjects, cmakeProjectsVector);
    std::vector<std::string>::iterator it;
    for (it = cmakeProjectsVector.begin(); it != cmakeProjectsVector.end();
         ++it) {
      if (it + 1 == cmakeProjectsVector.end() ||
          it + 2 == cmakeProjectsVector.end() ||
          it + 3 == cmakeProjectsVector.end()) {
        cmCPackLogger(
          cmCPackLog::LOG_ERROR,
          "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. "
          "CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install "
          "directory, install project name, install component, and install "
          "subdirectory."
            << std::endl);
        return 0;
      }
      std::string installDirectory = *it;
      ++it;
      std::string installProjectName = *it;
      ++it;
      cmCPackInstallCMakeProject project;

      project.Directory = installDirectory;
      project.ProjectName = installProjectName;
      project.Component = *it;
      ++it;
      project.SubDirectory = *it;

      std::vector<std::string> componentsVector;

      bool componentInstall = false;
      /*
       * We do a component install iff
       *    - the CPack generator support component
       *    - the user did not request Monolithic install
       *      (this works at CPack time too)
       */
      if (this->SupportsComponentInstallation() &&
          !(this->IsOn("CPACK_MONOLITHIC_INSTALL"))) {
        // Determine the installation types for this project (if provided).
        std::string installTypesVar = "CPACK_" +
          cmSystemTools::UpperCase(project.Component) + "_INSTALL_TYPES";
        const char* installTypes = this->GetOption(installTypesVar);
        if (installTypes && *installTypes) {
          std::vector<std::string> installTypesVector;
          cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
          for (std::string const& installType : installTypesVector) {
            project.InstallationTypes.push_back(
              this->GetInstallationType(project.ProjectName, installType));
          }
        }

        // Determine the set of components that will be used in this project
        std::string componentsVar =
          "CPACK_COMPONENTS_" + cmSystemTools::UpperCase(project.Component);
        const char* components = this->GetOption(componentsVar);
        if (components && *components) {
          cmSystemTools::ExpandListArgument(components, componentsVector);
          for (std::string const& comp : componentsVector) {
            project.Components.push_back(
              this->GetComponent(project.ProjectName, comp));
          }
          componentInstall = true;
        }
      }
      if (componentsVector.empty()) {
        componentsVector.push_back(project.Component);
      }

      const char* buildConfigCstr = this->GetOption("CPACK_BUILD_CONFIG");
      std::string buildConfig = buildConfigCstr ? buildConfigCstr : "";
      cmGlobalGenerator* globalGenerator =
        this->MakefileMap->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGenerator);
      if (!globalGenerator) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Specified package generator not found. "
                      "CPACK_CMAKE_GENERATOR value is invalid."
                        << std::endl);
        return 0;
      }
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(globalGenerator->GetForceUnixPaths());

      if (!this->RunPreinstallTarget(project.ProjectName, project.Directory,
                                     globalGenerator, buildConfig)) {
        return 0;
      }

      delete globalGenerator;

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install project: " << project.ProjectName << std::endl);

      // Run the installation for each component
      for (std::string const& component : componentsVector) {
        if (!this->InstallCMakeProject(
              setDestDir, project.Directory, baseTempInstallDirectory,
              default_dir_mode, component, componentInstall,
              project.SubDirectory, buildConfig, absoluteDestFiles)) {
          return 0;
        }
      }

      this->CMakeProjects.push_back(project);
    }
  }
  this->SetOption("CPACK_ABSOLUTE_DESTINATION_FILES",
                  absoluteDestFiles.c_str());
  return 1;
}